

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

BOOL __thiscall
Js::LocalsWalker::GetGroupObject
          (LocalsWalker *this,UIGroupType uiGroupType,int i,ResolvedObject *pResolvedObject)

{
  int iVar1;
  BOOL BVar2;
  Type *ppVVar3;
  VariableWalkerBase *variableWalker;
  int j;
  int scopeCount;
  ResolvedObject *pResolvedObject_local;
  int i_local;
  UIGroupType uiGroupType_local;
  LocalsWalker *this_local;
  
  if (this->pVarWalkers !=
      (List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    variableWalker._4_4_ = 0;
    for (variableWalker._0_4_ = 0;
        iVar1 = JsUtil::
                ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>::
                Count(&this->pVarWalkers->
                       super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                     ), (int)variableWalker < iVar1; variableWalker._0_4_ = (int)variableWalker + 1)
    {
      ppVVar3 = JsUtil::
                List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this->pVarWalkers,(int)variableWalker);
      if (((*ppVVar3)->groupType == uiGroupType) &&
         (variableWalker._4_4_ = variableWalker._4_4_ + 1, i < variableWalker._4_4_)) {
        BVar2 = VariableWalkerBase::GetGroupObject(*ppVVar3,pResolvedObject);
        return BVar2;
      }
    }
  }
  return 0;
}

Assistant:

BOOL LocalsWalker::GetGroupObject(Js::UIGroupType uiGroupType, int i, ResolvedObject* pResolvedObject)
    {
        if (pVarWalkers)
        {
            int scopeCount = 0;
            for (int j = 0; j < pVarWalkers->Count(); j++)
            {
                VariableWalkerBase* variableWalker = pVarWalkers->Item(j);

                if (variableWalker->groupType == uiGroupType)
                {
                    scopeCount++;
                    if (i < scopeCount)
                    {
                        return variableWalker->GetGroupObject(pResolvedObject);
                    }
                }
            }
        }
        return FALSE;
    }